

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O0

void __thiscall HighsCliqueTable::removeClique(HighsCliqueTable *this,HighsInt cliqueid)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  reference pvVar4;
  int in_ESI;
  HighsCliqueTable *in_RDI;
  HighsInt i;
  HighsInt len;
  HighsInt end;
  HighsInt start;
  HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int> *pHVar5;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffc9;
  undefined4 in_stack_ffffffffffffffd0;
  HighsCliqueTable *this_00;
  
  this_00 = in_RDI;
  pvVar4 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
           operator[](&in_RDI->cliques,(long)in_ESI);
  if ((pvVar4->origin != 0x7fffffff) &&
     (pvVar4 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
               operator[](&in_RDI->cliques,(long)in_ESI), pvVar4->origin != -1)) {
    std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::operator[]
              (&in_RDI->cliques,(long)in_ESI);
    std::vector<int,_std::allocator<int>_>::push_back
              (in_stack_ffffffffffffffc0,(value_type_conflict2 *)in_RDI);
  }
  pvVar4 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
           operator[](&in_RDI->cliques,(long)in_ESI);
  uVar3 = pvVar4->start;
  pvVar4 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
           operator[](&in_RDI->cliques,(long)in_ESI);
  uVar1 = pvVar4->end;
  iVar2 = uVar1 - uVar3;
  if (iVar2 == 2) {
    pHVar5 = &in_RDI->sizeTwoCliques;
    std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
    operator[](&in_RDI->cliqueentries,(long)(int)uVar3);
    std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
    operator[](&in_RDI->cliqueentries,(long)(int)(uVar3 + 1));
    sortedEdge(SUB84((ulong)pHVar5 >> 0x20,0),SUB84(pHVar5,0));
    HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::erase
              ((HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
                *)this_00,(KeyType *)CONCAT44(in_ESI,uVar3));
  }
  for (; uVar3 != uVar1; uVar3 = uVar3 + 1) {
    unlink(in_RDI,(char *)(ulong)uVar3);
  }
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_ffffffffffffffc0,(value_type_conflict2 *)in_RDI);
  std::set<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>::
  emplace<int&,int&>((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                      *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),
                     (int *)CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8),
                     (int *)in_stack_ffffffffffffffc0);
  pvVar4 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
           operator[](&in_RDI->cliques,(long)in_ESI);
  pvVar4->start = -1;
  pvVar4 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
           operator[](&in_RDI->cliques,(long)in_ESI);
  pvVar4->end = -1;
  in_RDI->numEntries = in_RDI->numEntries - iVar2;
  return;
}

Assistant:

void HighsCliqueTable::removeClique(HighsInt cliqueid) {
  if (cliques[cliqueid].origin != kHighsIInf && cliques[cliqueid].origin != -1)
    deletedrows.push_back(cliques[cliqueid].origin);

  HighsInt start = cliques[cliqueid].start;
  assert(start != -1);
  HighsInt end = cliques[cliqueid].end;
  HighsInt len = end - start;
  if (len == 2) {
    sizeTwoCliques.erase(
        sortedEdge(cliqueentries[start], cliqueentries[start + 1]));
  }

  for (HighsInt i = start; i != end; ++i) {
    unlink(i, cliqueid);
  }

  freeslots.push_back(cliqueid);
  freespaces.emplace(len, start);

  cliques[cliqueid].start = -1;
  cliques[cliqueid].end = -1;
  numEntries -= len;
}